

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 *puVar1;
  pointer pMVar2;
  uint uVar3;
  int _elempack;
  uint uVar4;
  uint _c;
  Mat *src;
  ulong _elemsize;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  pointer pMVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  undefined4 *puVar21;
  int iVar22;
  void *pvVar23;
  int iVar24;
  undefined4 *puVar25;
  void *pvVar26;
  int k;
  int iVar27;
  long lVar28;
  undefined4 *puVar29;
  int iVar30;
  void *pvVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  void *pvVar35;
  long lVar36;
  long lVar37;
  bool bVar38;
  Mat local_88;
  uint local_38;
  uint local_34;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar3 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar8 = (ulong)_elempack;
  lVar17 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar27 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar3 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      iVar18 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar28 = 0;
      iVar30 = 0;
      uVar20 = 0;
      do {
        uVar12 = *(uint *)(lVar17 + uVar20 * 4);
        uVar9 = (ulong)uVar12;
        if (uVar12 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar18 * _elempack - iVar30) / (uVar14 + lVar28);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar24 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar24),_elemsize / uVar8 << bVar7 * '\x02',iVar24,
                    opt->blob_allocator);
        pvVar31 = *(void **)((long)&pMVar11->data + lVar13);
        if (pvVar31 == (void *)0x0) {
          bVar38 = true;
        }
        else {
          bVar38 = (long)*(int *)((long)&pMVar11->c + lVar13) *
                   *(long *)((long)&pMVar11->cstep + lVar13) == 0;
        }
        if (bVar38) {
          return -100;
        }
        memcpy(pvVar31,(void *)((long)iVar30 * 4 + (long)src->data),
               (long)*(int *)((long)&pMVar11->w + lVar13) *
               *(long *)((long)&pMVar11->elemsize + lVar13));
        iVar30 = (int)uVar9 + iVar30;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar28 = lVar28 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar20 < uVar14);
    }
  }
  uVar12 = (iVar27 >> 0x1f & uVar3) + iVar27;
  if ((uVar3 == 2) && (uVar12 == 0)) {
    iVar27 = src->w;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    if (bVar38) {
      iVar18 = src->h;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar28 = 0;
      lVar13 = 0;
      iVar30 = 0;
      uVar20 = 0;
      do {
        uVar19 = *(uint *)(lVar17 + uVar20 * 4);
        uVar9 = (ulong)uVar19;
        if (uVar19 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar18 * _elempack - iVar30) / (uVar14 + lVar13);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar24 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar28),iVar27,
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar24),_elemsize / uVar8 << bVar7 * '\x02',iVar24,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar28) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar28) * *(long *)((long)&pMVar11->cstep + lVar28)
            == 0) {
          return -100;
        }
        iVar30 = iVar30 + (int)uVar9;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar28 = lVar28 + 0x48;
        bVar38 = uVar20 < uVar14;
      } while (bVar38);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar18 = pMVar11->elempack;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar10 = &pMVar11->elempack;
      do {
        if (*piVar10 < iVar18) {
          iVar18 = *piVar10;
        }
        piVar10 = piVar10 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_88.data = src->data;
    piVar10 = src->refcount;
    local_88.refcount._0_4_ = SUB84(piVar10,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)src->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_88.elempack = src->elempack;
    local_88.allocator = src->allocator;
    local_88.dims = src->dims;
    local_88.w = src->w;
    local_88.h = src->h;
    local_88.d = src->d;
    local_88.c = src->c;
    local_88.cstep = src->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    if (iVar18 < _elempack) {
      convert_packing(src,&local_88,iVar18,opt);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar11) {
      lVar13 = (long)iVar27;
      uVar14 = 0;
      puVar29 = (undefined4 *)local_88.data;
      do {
        pMVar11 = pMVar11 + uVar14;
        iVar30 = pMVar11->elempack;
        if (((iVar18 == 1) && (iVar30 == 4)) && (iVar24 = pMVar11->h, 0 < (long)iVar24)) {
          pvVar31 = pMVar11->data;
          iVar33 = pMVar11->w;
          sVar5 = pMVar11->elemsize;
          lVar28 = 0;
          do {
            if (0 < iVar27) {
              puVar21 = (undefined4 *)((long)iVar33 * sVar5 * lVar28 + (long)pvVar31);
              puVar25 = puVar29;
              iVar22 = iVar27;
              do {
                *puVar21 = *puVar25;
                puVar21[1] = puVar25[lVar13];
                puVar21[2] = puVar25[iVar27 * 2];
                puVar1 = puVar25 + iVar27 * 3;
                puVar25 = puVar25 + 1;
                puVar21[3] = *puVar1;
                puVar21 = puVar21 + 4;
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            puVar29 = puVar29 + lVar13 * 4;
            lVar28 = lVar28 + 1;
          } while (lVar28 != iVar24);
        }
        if (iVar18 == iVar30) {
          lVar28 = pMVar11->h * lVar13;
          memcpy(pMVar11->data,puVar29,pMVar11->elemsize * lVar28);
          puVar29 = puVar29 + (long)(int)lVar28 * (long)pMVar11->elempack;
        }
        uVar14 = uVar14 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar3 == 2) && (uVar12 == 1)) {
    uVar19 = src->h;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    if (bVar38) {
      iVar27 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar28 = 0;
      lVar13 = 0;
      iVar18 = 0;
      uVar20 = 0;
      do {
        iVar30 = *(int *)(lVar17 + uVar20 * 4);
        if (iVar30 == -0xe9) {
          iVar30 = (int)((ulong)((long)iVar27 - (long)iVar18) / (uVar14 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar28),iVar30,uVar19,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar28) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar28) * *(long *)((long)&pMVar11->cstep + lVar28)
            == 0) {
          return -100;
        }
        iVar18 = iVar18 + iVar30;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar28 = lVar28 + 0x48;
        bVar38 = uVar20 < uVar14;
      } while (bVar38);
    }
    if (0 < (int)uVar19) {
      uVar14 = 0;
      do {
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar11) {
          pvVar31 = (void *)((long)src->w * uVar14 * src->elemsize + (long)src->data);
          lVar13 = 0x2c;
          uVar20 = 0;
          do {
            lVar28 = (long)*(int *)((long)&pMVar11->data + lVar13);
            memcpy((void *)(uVar14 * lVar28 * *(long *)((long)pMVar11 + lVar13 + -0x1c) +
                           *(long *)((long)pMVar11 + lVar13 + -0x2c)),pvVar31,lVar28 * _elemsize);
            pvVar31 = (void *)((long)pvVar31 +
                              (long)*(int *)((long)&pMVar11->data + lVar13) * uVar8 * 4);
            uVar20 = uVar20 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar13 = lVar13 + 0x48;
          } while (uVar20 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar19);
    }
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar3 - 3 < 2) && (uVar12 == 0)) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    if (bVar38) {
      iVar27 = src->w;
      iVar18 = src->h;
      iVar30 = src->d;
      iVar24 = src->c;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar28 = 0;
      iVar33 = 0;
      uVar20 = 0;
      do {
        uVar19 = *(uint *)(lVar17 + uVar20 * 4);
        uVar9 = (ulong)uVar19;
        if (uVar19 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar24 * _elempack - iVar33) / (uVar14 + lVar28);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar22 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),iVar27,iVar18,iVar30,
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar22),_elemsize / uVar8 << bVar7 * '\x02',iVar22,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar13) == 0) {
          bVar38 = true;
        }
        else {
          bVar38 = (long)*(int *)((long)&pMVar11->c + lVar13) *
                   *(long *)((long)&pMVar11->cstep + lVar13) == 0;
        }
        if (bVar38) {
          return -100;
        }
        *(uint *)((long)&pMVar11->dims + lVar13) = uVar3;
        iVar33 = (int)uVar9 + iVar33;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar28 = lVar28 + -1;
        lVar13 = lVar13 + 0x48;
        bVar38 = uVar20 < uVar14;
      } while (bVar38);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar27 = pMVar11->elempack;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar10 = &pMVar11->elempack;
      do {
        if (*piVar10 < iVar27) {
          iVar27 = *piVar10;
        }
        piVar10 = piVar10 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_88.data = src->data;
    piVar10 = src->refcount;
    local_88.refcount._0_4_ = SUB84(piVar10,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)src->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_88.elempack = src->elempack;
    local_88.allocator = src->allocator;
    local_88.dims = src->dims;
    local_88.w = src->w;
    local_88.h = src->h;
    local_88.d = src->d;
    local_88.c = src->c;
    local_88.cstep = src->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    if (iVar27 < _elempack) {
      convert_packing(src,&local_88,iVar27,opt);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar11) {
      uVar20 = 0;
      uVar14 = 0;
      do {
        pMVar2 = pMVar11 + uVar20;
        if (((iVar27 == 1) && (pMVar11[uVar20].elempack == 4)) &&
           (iVar18 = pMVar2->c, 0 < (long)iVar18)) {
          iVar30 = pMVar2->h * pMVar2->w * pMVar2->d;
          pvVar31 = pMVar2->data;
          sVar5 = pMVar2->cstep;
          sVar6 = pMVar2->elemsize;
          uVar14 = (ulong)(int)uVar14;
          lVar28 = local_88.cstep * CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          pvVar23 = (void *)((uVar14 + 3) * lVar28 + (long)local_88.data);
          lVar13 = lVar28 * 4;
          pvVar26 = (void *)((uVar14 + 2) * lVar28 + (long)local_88.data);
          pvVar35 = (void *)((uVar14 + 1) * lVar28 + (long)local_88.data);
          pvVar16 = (void *)(lVar28 * uVar14 + (long)local_88.data);
          lVar28 = 0;
          do {
            if (0 < iVar30) {
              puVar29 = (undefined4 *)(sVar5 * sVar6 * lVar28 + (long)pvVar31);
              lVar32 = 0;
              do {
                *puVar29 = *(undefined4 *)((long)pvVar16 + lVar32 * 4);
                puVar29[1] = *(undefined4 *)((long)pvVar35 + lVar32 * 4);
                puVar29[2] = *(undefined4 *)((long)pvVar26 + lVar32 * 4);
                puVar29[3] = *(undefined4 *)((long)pvVar23 + lVar32 * 4);
                puVar29 = puVar29 + 4;
                lVar32 = lVar32 + 1;
              } while (iVar30 != (int)lVar32);
            }
            uVar14 = uVar14 + 4;
            lVar28 = lVar28 + 1;
            pvVar23 = (void *)((long)pvVar23 + lVar13);
            pvVar26 = (void *)((long)pvVar26 + lVar13);
            pvVar35 = (void *)((long)pvVar35 + lVar13);
            pvVar16 = (void *)((long)pvVar16 + lVar13);
          } while (lVar28 != iVar18);
        }
        if (iVar27 == pMVar2->elempack) {
          memcpy(pMVar2->data,
                 (void *)(local_88.cstep * (long)(int)uVar14 *
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) +
                         (long)local_88.data),
                 (long)((int)pMVar2->cstep * pMVar2->c) * pMVar2->elemsize);
          uVar14 = (ulong)(uint)((int)uVar14 + pMVar2->c);
        }
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar20 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    if (bVar38) {
      return -100;
    }
  }
  uVar15 = uVar3 ^ 4;
  uVar19 = uVar12 ^ 2;
  if ((uVar12 == 1 && (uVar3 ^ 3) == 0) || (uVar15 == 0 && uVar19 == 0)) {
    uVar4 = src->d;
    _c = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    local_38 = uVar19;
    local_34 = uVar15;
    if (bVar38) {
      iVar27 = src->w;
      iVar18 = src->h;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar28 = 0;
      lVar13 = 0;
      uVar20 = 0;
      iVar30 = 0;
      do {
        iVar24 = *(int *)(lVar17 + uVar20 * 4);
        if (iVar24 == -0xe9) {
          iVar24 = (int)((ulong)((long)iVar18 - (long)iVar30) / (uVar14 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar28),iVar27,iVar24,uVar4,_c,_elemsize,
                    _elempack,opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar28) == 0) {
          bVar38 = true;
        }
        else {
          bVar38 = (long)*(int *)((long)&pMVar11->c + lVar28) *
                   *(long *)((long)&pMVar11->cstep + lVar28) == 0;
        }
        if (bVar38) {
          return -100;
        }
        *(uint *)((long)&pMVar11->dims + lVar28) = uVar3;
        iVar30 = iVar24 + iVar30;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar28 = lVar28 + 0x48;
        bVar38 = uVar20 < uVar14;
      } while (bVar38);
    }
    if (0 < (int)_c) {
      uVar14 = 0;
      do {
        if (0 < (int)uVar4) {
          pvVar31 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          uVar20 = 0;
          do {
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar11) {
              lVar13 = 0x40;
              uVar9 = 0;
              do {
                lVar32 = (long)*(int *)((long)pMVar11 + lVar13 + -0x14);
                lVar36 = (long)*(int *)((long)pMVar11 + lVar13 + -0x10);
                lVar28 = *(long *)((long)pMVar11 + lVar13 + -0x30);
                lVar37 = lVar36 * lVar32;
                memcpy((void *)(lVar28 * lVar36 * uVar20 * lVar32 +
                               *(long *)((long)&pMVar11->data + lVar13) * uVar14 * lVar28 +
                               *(long *)((long)pMVar11 + lVar13 + -0x40)),pvVar31,lVar37 * _elemsize
                      );
                pvVar31 = (void *)((long)pvVar31 + (long)((int)lVar37 * _elempack) * 4);
                uVar9 = uVar9 + 1;
                pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                lVar13 = lVar13 + 0x48;
              } while (uVar9 < (ulong)(((long)(top_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar4);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != _c);
    }
    uVar15 = local_34;
    uVar19 = local_38;
    if (bVar38) {
      return -100;
    }
  }
  if (((uVar3 ^ 3) == 0 && uVar19 == 0) || (uVar15 == 0 && uVar12 == 3)) {
    uVar19 = src->h;
    uVar15 = src->d;
    uVar4 = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    if (bVar38) {
      iVar27 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar28 = 0;
      uVar20 = 0;
      iVar18 = 0;
      do {
        iVar30 = *(int *)(lVar17 + uVar20 * 4);
        if (iVar30 == -0xe9) {
          iVar30 = (int)((ulong)((long)iVar27 - (long)iVar18) / (uVar14 + lVar28));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),iVar30,uVar19,uVar15,uVar4,_elemsize,
                    _elempack,opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar13) == 0) {
          bVar38 = true;
        }
        else {
          bVar38 = (long)*(int *)((long)&pMVar11->c + lVar13) *
                   *(long *)((long)&pMVar11->cstep + lVar13) == 0;
        }
        if (bVar38) {
          return -100;
        }
        *(uint *)((long)&pMVar11->dims + lVar13) = uVar3;
        iVar18 = iVar30 + iVar18;
        uVar20 = uVar20 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar28 = lVar28 + -1;
        lVar13 = lVar13 + 0x48;
        bVar38 = uVar20 < uVar14;
      } while (bVar38);
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        if (0 < (int)uVar15) {
          pvVar31 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          uVar20 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar9 = 0;
              do {
                pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish != pMVar11) {
                  lVar13 = 0x40;
                  uVar34 = 0;
                  do {
                    lVar32 = (long)*(int *)((long)pMVar11 + lVar13 + -0x14);
                    lVar28 = *(long *)((long)pMVar11 + lVar13 + -0x30);
                    lVar36 = lVar28 * lVar32;
                    memcpy((void *)(lVar36 * uVar9 +
                                    (long)*(int *)((long)pMVar11 + lVar13 + -0x10) * uVar20 * lVar36
                                   + *(long *)((long)&pMVar11->data + lVar13) * uVar14 * lVar28 +
                                     *(long *)((long)pMVar11 + lVar13 + -0x40)),pvVar31,
                           lVar32 * _elemsize);
                    pvVar31 = (void *)((long)pvVar31 +
                                      (long)*(int *)((long)pMVar11 + lVar13 + -0x14) * uVar8 * 4);
                    uVar34 = uVar34 + 1;
                    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar13 = lVar13 + 0x48;
                  } while (uVar34 < (ulong)(((long)(top_blobs->
                                                                                                      
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar19);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar15);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar3 == 4) && (uVar12 == 1)) {
    uVar3 = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar38 = lVar13 != 0;
    if (bVar38) {
      iVar27 = src->w;
      iVar18 = src->h;
      iVar30 = src->d;
      uVar8 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar28 = 0;
      lVar13 = 0;
      uVar14 = 0;
      iVar24 = 0;
      do {
        iVar33 = *(int *)(lVar17 + uVar14 * 4);
        if (iVar33 == -0xe9) {
          iVar33 = (int)((ulong)((long)iVar30 - (long)iVar24) / (uVar8 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar28),iVar27,iVar18,iVar33,uVar3,_elemsize,
                    _elempack,opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar28) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar28) * *(long *)((long)&pMVar11->cstep + lVar28)
            == 0) {
          return -100;
        }
        iVar24 = iVar24 + iVar33;
        uVar14 = uVar14 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar28 = lVar28 + 0x48;
        bVar38 = uVar14 < uVar8;
      } while (bVar38);
    }
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar11) {
          pvVar31 = (void *)(src->cstep * uVar8 * src->elemsize + (long)src->data);
          lVar17 = 0x40;
          uVar14 = 0;
          do {
            lVar13 = (long)*(int *)((long)pMVar11 + lVar17 + -0xc) *
                     (long)*(int *)((long)pMVar11 + lVar17 + -0x10) *
                     (long)*(int *)((long)pMVar11 + lVar17 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar11->data + lVar17) * uVar8 *
                            *(long *)((long)pMVar11 + lVar17 + -0x30) +
                           *(long *)((long)pMVar11 + lVar17 + -0x40)),pvVar31,lVar13 * _elemsize);
            pvVar31 = (void *)((long)pvVar31 + (long)((int)lVar13 * _elempack) * 4);
            uVar14 = uVar14 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x48;
          } while (uVar14 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar3);
    }
    if (bVar38) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    int size = top_blob.w * top_blob.h;

                    float* outptr = top_blob.channel(p).depth(j);
                    memcpy(outptr, ptr, size * elemsize);

                    ptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (int k = 0; k < h; k++)
                {
                    for (size_t i = 0; i < top_blobs.size(); i++)
                    {
                        Mat& top_blob = top_blobs[i];

                        float* outptr = top_blob.channel(p).depth(j).row(k);
                        memcpy(outptr, ptr, top_blob.w * elemsize);

                        ptr += top_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (d - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h * top_blob.d;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    return 0;
}